

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O1

void witness_print_witnesses(witness_list_t *witnesses)

{
  witness_t *pwVar1;
  witness_t *w;
  uint n;
  witness_t *w_00;
  
  if (witnesses->qlh_first == (witness_t *)0x0) {
    w = (witness_t *)0x0;
    n = 0;
  }
  else {
    n = 0;
    pwVar1 = witnesses->qlh_first;
    w_00 = (witness_t *)0x0;
    do {
      w = pwVar1;
      if ((w_00 == (witness_t *)0x0) || (w->rank <= w_00->rank)) {
        n = n + 1;
      }
      else {
        witness_print_witness(w_00,n);
        n = 1;
      }
      pwVar1 = (w->link).qre_next;
      if (pwVar1 == witnesses->qlh_first) {
        pwVar1 = (witness_t *)0x0;
      }
      w_00 = w;
    } while (pwVar1 != (witness_t *)0x0);
  }
  if (w == (witness_t *)0x0) {
    return;
  }
  witness_print_witness(w,n);
  return;
}

Assistant:

static void
witness_print_witnesses(const witness_list_t *witnesses) {
	witness_t *w, *last = NULL;
	unsigned n = 0;
	ql_foreach(w, witnesses, link) {
		if (last != NULL && w->rank > last->rank) {
			assert(w->name != last->name);
			witness_print_witness(last, n);
			n = 0;
		} else if (last != NULL) {
			assert(w->rank == last->rank);
			assert(w->name == last->name);
		}
		last = w;
		++n;
	}
	if (last != NULL) {
		witness_print_witness(last, n);
	}
}